

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buf1,uint *buf2,ushort *distxs,ushort *distys,int len,QTextureData *image,
               qreal *fx,qreal *fy,qreal *fw,qreal fdx,qreal fdy,qreal fdw)

{
  double dVar1;
  uint uVar2;
  uchar *puVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double __x;
  double __x_00;
  
  if (0 < len) {
    puVar3 = image->imageData;
    lVar4 = image->bytesPerLine;
    uVar15 = 0;
    do {
      uVar16 = -(ulong)(*fw == 0.0);
      dVar5 = (double)(uVar16 & 0x40d0000000000000 | ~uVar16 & (ulong)(1.0 / *fw));
      dVar1 = *fx;
      __x_00 = dVar5 * dVar1 + -0.5;
      __x = *fy * dVar5 + -0.5;
      dVar5 = floor(__x_00);
      dVar6 = floor(__x);
      distxs[uVar15] = (ushort)(int)((__x_00 - (double)(int)dVar5) * 65536.0);
      distys[uVar15] = (ushort)(int)((__x - (double)(int)dVar6) * 65536.0);
      uVar10 = image->width;
      uVar2 = image->height;
      iVar7 = (int)dVar5 % (int)uVar10;
      uVar8 = iVar7 >> 0x1f & uVar10;
      uVar13 = uVar8 + iVar7 + 1;
      if (uVar13 == uVar10) {
        uVar13 = 0;
      }
      iVar11 = (int)dVar6 % (int)uVar2;
      uVar9 = iVar11 >> 0x1f & uVar2;
      uVar10 = uVar9 + iVar11 + 1;
      if (uVar10 == uVar2) {
        uVar10 = 0;
      }
      lVar14 = (int)(uVar9 + iVar11) * lVar4;
      lVar12 = (long)(int)(uVar8 + iVar7);
      buf1[uVar15 * 2] = *(uint *)(puVar3 + lVar12 * 4 + lVar14);
      buf1[uVar15 * 2 + 1] = *(uint *)(puVar3 + (long)(int)uVar13 * 4 + lVar14);
      lVar14 = (int)uVar10 * lVar4;
      buf2[uVar15 * 2] = *(uint *)(puVar3 + lVar12 * 4 + lVar14);
      buf2[uVar15 * 2 + 1] = *(uint *)(puVar3 + (long)(int)uVar13 * 4 + lVar14);
      *fx = dVar1 + fdx;
      *fy = *fy + fdy;
      *fw = *fw + fdw;
      uVar15 = uVar15 + 1;
    } while ((uint)len != uVar15);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_slow_fetcher(T *buf1, T *buf2, ushort *distxs, ushort *distys,
                                                              const int len, const QTextureData &image,
                                                              qreal &fx, qreal &fy, qreal &fw,
                                                              const qreal fdx, const qreal fdy, const qreal fdw)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp);

    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;

    for (int i = 0; i < len; ++i) {
        const qreal iw = fw == 0 ? 16384 : 1 / fw;
        const qreal px = fx * iw - qreal(0.5);
        const qreal py = fy * iw - qreal(0.5);

        int x1 = qFloor(px);
        int x2;
        int y1 = qFloor(py);
        int y2;

        distxs[i] = ushort((px - x1) * (1<<16));
        distys[i] = ushort((py - y1) * (1<<16));

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);
        if constexpr (useFetch) {
            buf1[i * 2 + 0] = fetch1(s1, x1);
            buf1[i * 2 + 1] = fetch1(s1, x2);
            buf2[i * 2 + 0] = fetch1(s2, x1);
            buf2[i * 2 + 1] = fetch1(s2, x2);
        } else {
            buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
            buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
            buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
            buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
        }

        fx += fdx;
        fy += fdy;
        fw += fdw;
    }
}